

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O0

PtrWrapper<MapWrapper> * __thiscall
ashared_ptr<MapWrapper>::shareCurObject(ashared_ptr<MapWrapper> *this)

{
  __pointer_type pPVar1;
  atomic<unsigned_long> *paVar2;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  memory_order __m;
  atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*> *in_stack_ffffffffffffffa8;
  __pointer_type local_30;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __m = (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  pPVar1 = std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::load
                     (in_stack_ffffffffffffffa8,__m);
  if (pPVar1 == (__pointer_type)0x0) {
    local_30 = (__pointer_type)0x0;
  }
  else {
    pPVar1 = std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::load
                       (in_stack_ffffffffffffffa8,__m);
    paVar2 = &pPVar1->refCount;
    LOCK();
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    local_30 = std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::load
                         ((atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*> *)0xffffffff,
                          (memory_order)((ulong)paVar2 >> 0x20));
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x104689);
  return local_30;
}

Assistant:

PtrWrapper<T>* shareCurObject() {
        std::lock_guard<std::mutex> l(lock);
        if (!object.load(MO)) return nullptr;

        // Now no one can change `object`.
        // By increasing its ref count, `object` will be safe
        // until the new holder (i.e., caller) is destructed.
        object.load(MO)->refCount.fetch_add(1, MO);
        return object.load(MO);
    }